

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp9d_rkv.c
# Opt level: O0

MPP_RET hal_vp9d_rkv_start(void *hal,HalTaskInfo *task)

{
  long lVar1;
  MppDev ctx;
  undefined8 uStack_78;
  RK_U32 reg_size;
  MppDevRegRdCfg rd_cfg;
  MppDevRegWrCfg wr_cfg;
  uint *puStack_50;
  RK_U32 i;
  RK_U32 *p;
  RK_S32 index;
  MppDev dev;
  VP9_REGS *hw_regs;
  Vp9dRkvCtx *hw_ctx;
  HalVp9dCtx *p_hal;
  MPP_RET ret;
  HalTaskInfo *task_local;
  void *hal_local;
  
  lVar1 = *(long *)((long)hal + 0x40);
  dev = *(MppDev *)(lVar1 + 0xe0);
  ctx = *(MppDev *)((long)hal + 0x10);
  if (*(int *)((long)hal + 0x38) != 0) {
    dev = *(MppDev *)(lVar1 + (long)(task->dec).reg_index * 0x40 + 0x30);
  }
  if ((dev == (MppDev)0x0) &&
     (_mpp_log_l(2,"hal_vp9d_rkv","Assertion %s failed at %s:%d\n",(char *)0x0,"hw_regs",
                 "hal_vp9d_rkv_start",0x21a), (mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  if ((hal_vp9d_debug & 4) != 0) {
    puStack_50 = (uint *)dev;
    for (wr_cfg.offset = 0; wr_cfg.offset < 0x4e; wr_cfg.offset = wr_cfg.offset + 1) {
      _mpp_log_l(4,"hal_vp9d_rkv","set regs[%02d]: %08X\n",(char *)0x0,(ulong)wr_cfg.offset,
                 (ulong)*puStack_50);
      puStack_50 = puStack_50 + 1;
    }
  }
  rd_cfg._8_8_ = *(undefined8 *)(lVar1 + 0xe0);
  p_hal._4_4_ = mpp_dev_ioctl(ctx,4,&rd_cfg.size);
  if (p_hal._4_4_ == MPP_OK) {
    uStack_78 = *(undefined8 *)(lVar1 + 0xe0);
    rd_cfg.reg._0_4_ = 0x138;
    rd_cfg.reg._4_4_ = 0;
    p_hal._4_4_ = mpp_dev_ioctl(ctx,5,&stack0xffffffffffffff88);
    if (p_hal._4_4_ == MPP_OK) {
      p_hal._4_4_ = mpp_dev_ioctl(ctx,0xf,(void *)0x0);
      if (p_hal._4_4_ != MPP_OK) {
        _mpp_log_l(2,"hal_vp9d_rkv","send cmd failed %d\n","hal_vp9d_rkv_start",
                   (ulong)(uint)p_hal._4_4_);
      }
    }
    else {
      _mpp_log_l(2,"hal_vp9d_rkv","set register read failed %d\n","hal_vp9d_rkv_start",
                 (ulong)(uint)p_hal._4_4_);
    }
  }
  else {
    _mpp_log_l(2,"hal_vp9d_rkv","set register write failed %d\n","hal_vp9d_rkv_start",
               (ulong)(uint)p_hal._4_4_);
  }
  return p_hal._4_4_;
}

Assistant:

MPP_RET hal_vp9d_rkv_start(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_OK;
    HalVp9dCtx *p_hal = (HalVp9dCtx *)hal;
    Vp9dRkvCtx *hw_ctx = (Vp9dRkvCtx*)p_hal->hw_ctx;
    VP9_REGS *hw_regs = (VP9_REGS *)hw_ctx->hw_regs;
    MppDev dev = p_hal->dev;

    if (p_hal->fast_mode) {
        RK_S32 index =  task->dec.reg_index;
        hw_regs = (VP9_REGS *)hw_ctx->g_buf[index].hw_regs;
    }

    mpp_assert(hw_regs);

    if (hal_vp9d_debug & HAL_VP9D_DBG_REG) {
        RK_U32 *p = (RK_U32 *)hw_regs;
        RK_U32 i = 0;

        for (i = 0; i < sizeof(VP9_REGS) / 4; i++)
            mpp_log("set regs[%02d]: %08X\n", i, *p++);
    }

    do {
        MppDevRegWrCfg wr_cfg;
        MppDevRegRdCfg rd_cfg;
        RK_U32 reg_size = sizeof(VP9_REGS);

        wr_cfg.reg = hw_ctx->hw_regs;
        wr_cfg.size = reg_size;
        wr_cfg.offset = 0;

        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            break;
        }

        rd_cfg.reg = hw_ctx->hw_regs;
        rd_cfg.size = reg_size;
        rd_cfg.offset = 0;

        ret = mpp_dev_ioctl(dev, MPP_DEV_REG_RD, &rd_cfg);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            break;
        }

        ret = mpp_dev_ioctl(dev, MPP_DEV_CMD_SEND, NULL);
        if (ret) {
            mpp_err_f("send cmd failed %d\n", ret);
            break;
        }
    } while (0);

    (void)task;
    return ret;
}